

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Section * __thiscall
asmjit::v1_14::CodeHolder::sectionByName(CodeHolder *this,char *name,size_t nameSize)

{
  FixedString<36UL> *__s1;
  uint uVar1;
  long lVar2;
  Section *pSVar3;
  int iVar4;
  long lVar5;
  
  if (nameSize == 0xffffffffffffffff) {
    nameSize = strlen(name);
  }
  if (nameSize < 0x24) {
    lVar2 = *(long *)&this->_sections;
    uVar1 = *(uint *)&this->field_0xe0;
    for (lVar5 = 0; (ulong)uVar1 << 3 != lVar5; lVar5 = lVar5 + 8) {
      pSVar3 = *(Section **)(lVar2 + lVar5);
      __s1 = &pSVar3->_name;
      iVar4 = bcmp(__s1,name,nameSize);
      if ((iVar4 == 0) && (__s1->str[nameSize] == '\0')) {
        return pSVar3;
      }
    }
  }
  return (Section *)0x0;
}

Assistant:

Section* CodeHolder::sectionByName(const char* name, size_t nameSize) const noexcept {
  if (nameSize == SIZE_MAX)
    nameSize = strlen(name);

  // This could be also put in a hash-table similarly like we do with labels,
  // however it's questionable as the number of sections should be pretty low
  // in general. Create an issue if this becomes a problem.
  if (nameSize <= Globals::kMaxSectionNameSize) {
    for (Section* section : _sections)
      if (memcmp(section->_name.str, name, nameSize) == 0 && section->_name.str[nameSize] == '\0')
        return section;
  }

  return nullptr;
}